

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

GPU_Renderer * gpu_create_and_add_renderer(GPU_RendererID id)

{
  GPU_RendererID id_00;
  GPU_Renderer *pGVar1;
  undefined8 in_stack_ffffffffffffffd0;
  GPU_Renderer *renderer;
  int i;
  
  renderer._4_4_ = 0;
  while( true ) {
    if (0x13 < renderer._4_4_) {
      GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                        "Couldn\'t create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d)."
                        ,0x14);
      return (GPU_Renderer *)0x0;
    }
    if (_gpu_renderer_map[renderer._4_4_] == (GPU_Renderer *)0x0) break;
    renderer._4_4_ = renderer._4_4_ + 1;
  }
  id_00._16_8_ = in_stack_ffffffffffffffd0;
  id_00.name = id.name;
  id_00.renderer = id.renderer;
  id_00.major_version = id.major_version;
  pGVar1 = GPU_CreateRenderer(id_00);
  if (pGVar1 == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("gpu_create_and_add_renderer",GPU_ERROR_BACKEND_ERROR,
                      "Failed to create new renderer.");
    return (GPU_Renderer *)0x0;
  }
  _gpu_renderer_map[renderer._4_4_] = pGVar1;
  return pGVar1;
}

Assistant:

GPU_Renderer* gpu_create_and_add_renderer(GPU_RendererID id)
{
	int i;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] == NULL)
		{
			// Create
			GPU_Renderer* renderer = GPU_CreateRenderer(id);
			if(renderer == NULL)
            {
                GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Failed to create new renderer.");
                return NULL;
            }
            
			// Add
			_gpu_renderer_map[i] = renderer;
			// Return
			return renderer;
		}
	}
	
    GPU_PushErrorCode(__func__, GPU_ERROR_BACKEND_ERROR, "Couldn't create a new renderer.  Too many active renderers for GPU_MAX_ACTIVE_RENDERERS (%d).", GPU_MAX_ACTIVE_RENDERERS);
	return NULL;
}